

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdevicediscovery_udev_p.cpp
# Opt level: O3

void QDeviceDiscoveryUDev::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  udev_device *dev;
  char *pcVar4;
  long lVar5;
  udev_device *dev_00;
  storage_type *psVar6;
  char *pcVar7;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  QLatin1String QVar9;
  QLatin1String QVar10;
  QArrayData *pQStack_68;
  char16_t *pcStack_60;
  qsizetype qStack_58;
  QString QStack_48;
  long lStack_28;
  
  if (_c != InvokeMetaMethod || _id != 0) {
    return;
  }
  lStack_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(_o + 0x20) == 0) goto LAB_001097e0;
  QStack_48.d.d = (Data *)0x0;
  QStack_48.d.ptr = (char16_t *)0x0;
  QStack_48.d.size = 0;
  dev = (udev_device *)udev_monitor_receive_device();
  if (dev != (udev_device *)0x0) {
    pcVar4 = (char *)udev_device_get_action(dev);
    if (pcVar4 != (char *)0x0) {
      lVar5 = udev_device_get_devnode(dev);
      if (lVar5 != 0) {
        psVar6 = (storage_type *)0xffffffffffffffff;
        do {
          pcVar7 = psVar6 + lVar5 + 1;
          psVar6 = psVar6 + 1;
        } while (*pcVar7 != '\0');
        QVar8.m_data = psVar6;
        QVar8.m_size = (qsizetype)&pQStack_68;
        QString::fromUtf8(QVar8);
        QStack_48.d.d = (Data *)pQStack_68;
        QStack_48.d.ptr = pcStack_60;
        QStack_48.d.size = qStack_58;
        QVar9.m_data = (char *)0x10;
        QVar9.m_size = (qsizetype)&QStack_48;
        cVar1 = QString::startsWith(QVar9,0x10a98b);
        if (cVar1 == '\0') {
          QVar10.m_data = (char *)0xd;
          QVar10.m_size = (qsizetype)&QStack_48;
          cVar1 = QString::startsWith(QVar10,0x10a99c);
          if (cVar1 == '\0') goto LAB_001097b5;
          pcVar7 = "drm";
        }
        else {
          pcVar7 = "input";
        }
        bVar2 = checkDeviceType((QDeviceDiscoveryUDev *)_o,dev);
        if (bVar2) {
LAB_00109775:
          iVar3 = qstrcmp(pcVar4,"add");
          if (iVar3 == 0) {
            QDeviceDiscovery::deviceDetected((QDeviceDiscovery *)_o,&QStack_48);
          }
          iVar3 = qstrcmp(pcVar4,"remove");
          if (iVar3 == 0) {
            QDeviceDiscovery::deviceRemoved((QDeviceDiscovery *)_o,&QStack_48);
          }
        }
        else {
          dev_00 = (udev_device *)udev_device_get_parent_with_subsystem_devtype(dev,pcVar7,0);
          if (dev_00 != (udev_device *)0x0) {
            bVar2 = checkDeviceType((QDeviceDiscoveryUDev *)_o,dev_00);
            if (bVar2) goto LAB_00109775;
          }
        }
      }
    }
  }
LAB_001097b5:
  udev_device_unref(dev);
  if (&(QStack_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((QStack_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((QStack_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QStack_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(QStack_48.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_001097e0:
  if (*(long *)(in_FS_OFFSET + 0x28) == lStack_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDeviceDiscoveryUDev::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDeviceDiscoveryUDev *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->handleUDevNotification(); break;
        default: ;
        }
    }
    (void)_a;
}